

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O3

StackSize * __thiscall
miniscript::Node<CPubKey>::CalcStackSize(StackSize *__return_storage_ptr__,Node<CPubKey> *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  pointer pSVar6;
  pointer pSVar7;
  int iVar8;
  pointer psVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  element_type *peVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  element_type *peVar19;
  ulong uVar20;
  char cVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  int32_t iVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  long in_FS_OFFSET;
  SatInfo SVar30;
  vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_> next_sats;
  vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_> sats;
  SatInfo local_88;
  vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_> local_78;
  vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(this->fragment) {
  case JUST_0:
    (__return_storage_ptr__->sat).valid = false;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).netdiff = 0;
    (__return_storage_ptr__->sat).exec = 0;
    (__return_storage_ptr__->dsat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->dsat).field_0x1 = 0;
    (__return_storage_ptr__->dsat).netdiff = -1;
    (__return_storage_ptr__->dsat).exec = 0;
    break;
  case JUST_1:
  case OLDER:
  case AFTER:
    (__return_storage_ptr__->sat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).netdiff = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      *(undefined8 *)&(__return_storage_ptr__->sat).exec = 0;
      (__return_storage_ptr__->dsat).netdiff = 0;
      (__return_storage_ptr__->dsat).exec = 0;
      return __return_storage_ptr__;
    }
    goto LAB_00717452;
  case PK_K:
    lVar13 = -0xffffffff;
    (__return_storage_ptr__->sat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).netdiff = -1;
    iVar10 = 0;
    goto LAB_00716969;
  case PK_H:
    lVar13 = 1;
    (__return_storage_ptr__->sat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).netdiff = 0;
    iVar10 = 2;
    goto LAB_00716969;
  case SHA256:
  case HASH256:
  case RIPEMD160:
  case HASH160:
    (__return_storage_ptr__->sat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).netdiff = 0;
    (__return_storage_ptr__->sat).exec = 2;
    goto LAB_007171d9;
  case WRAP_A:
  case WRAP_S:
  case WRAP_N:
    peVar14 = (((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      *(undefined8 *)&(__return_storage_ptr__->dsat).netdiff =
           *(undefined8 *)((long)&peVar14->ss + 0x10);
      uVar1 = *(undefined8 *)&(peVar14->ss).sat;
      uVar2 = *(undefined8 *)((long)&peVar14->ss + 8);
      (__return_storage_ptr__->sat).valid = (bool)(char)uVar1;
      *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)((ulong)uVar1 >> 8);
      (__return_storage_ptr__->sat).netdiff = (int)((ulong)uVar1 >> 0x20);
      *(undefined8 *)&(__return_storage_ptr__->sat).exec = uVar2;
      return __return_storage_ptr__;
    }
    goto LAB_00717452;
  case WRAP_C:
    peVar14 = (((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    iVar10 = 0;
    if ((peVar14->ss).sat.valid == '\x01') {
      iVar11 = *(int32_t *)((long)&peVar14->ss + 8);
      iVar15 = 0;
      if (0 < iVar11) {
        iVar15 = iVar11;
      }
      iVar15 = iVar15 + 1;
      uVar28 = (ulong)(*(int32_t *)((long)&peVar14->ss + 4) + 1) << 0x20;
      uVar17 = 1;
    }
    else {
      uVar28 = 0;
      uVar17 = 0;
      iVar15 = 0;
    }
    uVar28 = uVar28 | uVar17;
    if (((SatInfo *)((long)&peVar14->ss + 0xc))->valid == true) {
      iVar11 = *(int32_t *)((long)&peVar14->ss + 0x14);
      iVar10 = 0;
      if (0 < iVar11) {
        iVar10 = iVar11;
      }
      iVar10 = iVar10 + 1;
      uVar18 = (ulong)(*(int32_t *)((long)&peVar14->ss + 0x10) + 1) << 0x20;
      uVar17 = 1;
    }
    else {
      uVar18 = 0;
      uVar17 = 0;
    }
    uVar18 = uVar18 | uVar17;
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar28;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)(uVar28 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)(uVar28 >> 0x20);
    (__return_storage_ptr__->sat).exec = iVar15;
    goto LAB_00717217;
  case WRAP_D:
  case WRAP_J:
    peVar14 = (((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    if ((peVar14->ss).sat.valid == '\x01') {
      uVar22 = *(int32_t *)((long)&peVar14->ss + 4);
      iVar15 = *(int32_t *)((long)&peVar14->ss + 8);
      iVar10 = uVar22 + 1;
      if (iVar10 < iVar15) {
        iVar10 = iVar15;
      }
      uVar28 = (ulong)uVar22 << 0x20;
      uVar17 = 1;
    }
    else {
      uVar28 = 0;
      uVar17 = 0;
      iVar10 = 0;
    }
    uVar28 = uVar28 | uVar17;
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar28;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)(uVar28 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)(uVar28 >> 0x20);
    (__return_storage_ptr__->sat).exec = iVar10;
    (__return_storage_ptr__->dsat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->dsat).field_0x1 = 0;
    (__return_storage_ptr__->dsat).netdiff = 0;
    (__return_storage_ptr__->dsat).exec = 1;
    break;
  case WRAP_V:
    peVar14 = (((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    if ((peVar14->ss).sat.valid == '\x01') {
      iVar10 = *(int32_t *)((long)&peVar14->ss + 8);
      uVar22 = *(int32_t *)((long)&peVar14->ss + 4) + 1;
      iVar15 = 0;
      if (0 < iVar10) {
        iVar15 = iVar10;
      }
      iVar10 = iVar15 + 1;
      goto LAB_00716a73;
    }
LAB_00716a7e:
    uVar28 = 0;
    uVar17 = 0;
    iVar10 = 0;
    goto LAB_00716a84;
  case AND_V:
    psVar9 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar14 = (psVar9->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    if (((peVar14->ss).sat.valid != '\x01') ||
       (peVar19 = psVar9[1].
                  super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr, (peVar19->ss).sat.valid != '\x01')) goto LAB_00716a7e;
    iVar10 = *(int32_t *)((long)&peVar19->ss + 4);
    iVar15 = *(int32_t *)((long)&peVar19->ss + 8);
    uVar22 = *(int32_t *)((long)&peVar14->ss + 4) + iVar10;
    iVar10 = iVar10 + *(int32_t *)((long)&peVar14->ss + 8);
    if (iVar10 < iVar15) {
      iVar10 = iVar15;
    }
LAB_00716a73:
    uVar28 = (ulong)uVar22 << 0x20;
    uVar17 = 1;
LAB_00716a84:
    uVar28 = uVar28 | uVar17;
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar28;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)(uVar28 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)(uVar28 >> 0x20);
    (__return_storage_ptr__->sat).exec = iVar10;
    goto LAB_007171d9;
  case AND_B:
    psVar9 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar14 = (psVar9->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar19 = psVar9[1].
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    iVar10 = 0;
    if (((peVar14->ss).sat.valid == '\x01') && ((peVar19->ss).sat.valid == '\x01')) {
      iVar15 = *(int32_t *)((long)&peVar19->ss + 4);
      iVar24 = iVar15 + *(int32_t *)((long)&peVar14->ss + 8);
      iVar11 = *(int32_t *)((long)&peVar19->ss + 8);
      if (iVar24 < iVar11) {
        iVar24 = iVar11;
      }
      uVar17 = (ulong)(*(int32_t *)((long)&peVar14->ss + 4) + iVar15 + 1) << 0x20;
      iVar15 = 0;
      if (0 < iVar24) {
        iVar15 = iVar24;
      }
      iVar15 = iVar15 + 1;
      uVar28 = 1;
    }
    else {
      uVar28 = 0;
      uVar17 = 0;
      iVar15 = 0;
    }
    uVar28 = uVar28 | uVar17;
    if (((SatInfo *)((long)&peVar14->ss + 0xc))->valid == true) {
      if (((SatInfo *)((long)&peVar19->ss + 0xc))->valid == true) {
        iVar10 = *(int32_t *)((long)&peVar19->ss + 0x10);
        iVar24 = iVar10 + *(int32_t *)((long)&peVar14->ss + 0x14);
        iVar11 = *(int32_t *)((long)&peVar19->ss + 0x14);
        if (iVar24 < iVar11) {
          iVar24 = iVar11;
        }
        uVar17 = (ulong)(*(int32_t *)((long)&peVar14->ss + 0x10) + iVar10 + 1) << 0x20;
        iVar10 = 0;
        if (0 < iVar24) {
          iVar10 = iVar24;
        }
        iVar10 = iVar10 + 1;
        uVar18 = 1;
      }
      else {
        uVar18 = 0;
        uVar17 = 0;
        iVar10 = 0;
      }
    }
    else {
      uVar18 = 0;
      uVar17 = 0;
    }
    uVar18 = uVar18 | uVar17;
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar28;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)(uVar28 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)(uVar28 >> 0x20);
    (__return_storage_ptr__->sat).exec = iVar15;
LAB_00717217:
    (__return_storage_ptr__->dsat).valid = (bool)(char)uVar18;
    *(int3 *)&(__return_storage_ptr__->dsat).field_0x1 = (int3)(uVar18 >> 8);
    (__return_storage_ptr__->dsat).netdiff = (int)(uVar18 >> 0x20);
    (__return_storage_ptr__->dsat).exec = iVar10;
    break;
  case OR_B:
    psVar9 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar14 = (psVar9->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar19 = psVar9[1].
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    iVar10 = 0;
    if (((peVar14->ss).sat.valid == '\x01') &&
       (((SatInfo *)((long)&peVar19->ss + 0xc))->valid == true)) {
      iVar15 = *(int32_t *)((long)&peVar19->ss + 0x10);
      iVar24 = *(int32_t *)((long)&peVar19->ss + 0x14);
      iVar11 = *(int32_t *)((long)&peVar14->ss + 4) + iVar15;
      iVar15 = iVar15 + *(int32_t *)((long)&peVar14->ss + 8);
      if (iVar15 < iVar24) {
        iVar15 = iVar24;
      }
      bVar5 = true;
    }
    else {
      iVar11 = 0;
      bVar5 = false;
      iVar15 = 0;
    }
    cVar21 = ((SatInfo *)((long)&peVar14->ss + 0xc))->valid;
    if (cVar21 == '\x01') {
      if ((peVar19->ss).sat.valid == '\x01') {
        iVar10 = *(int32_t *)((long)&peVar19->ss + 4);
        iVar12 = *(int32_t *)((long)&peVar19->ss + 8);
        iVar24 = *(int32_t *)((long)&peVar14->ss + 0x10) + iVar10;
        iVar10 = iVar10 + *(int32_t *)((long)&peVar14->ss + 0x14);
        if (iVar10 < iVar12) {
          iVar10 = iVar12;
        }
        bVar4 = true;
      }
      else {
        iVar24 = 0;
        bVar4 = false;
        iVar10 = 0;
      }
    }
    else {
      iVar24 = 0;
      bVar4 = false;
    }
    iVar12 = iVar24;
    iVar8 = iVar10;
    bVar3 = bVar4;
    if ((bVar5) && (iVar12 = iVar11, iVar8 = iVar15, bVar3 = bVar5, bVar4)) {
      iVar12 = iVar24;
      if (iVar24 < iVar11) {
        iVar12 = iVar11;
      }
      iVar8 = iVar10;
      if (iVar10 < iVar15) {
        iVar8 = iVar15;
      }
LAB_0071726d:
      iVar10 = 0;
      if (0 < iVar8) {
        iVar10 = iVar8;
      }
      iVar25 = iVar10 + 1;
      uVar18 = (ulong)(iVar12 + 1) << 0x20;
      uVar28 = 1;
    }
    else {
      if (bVar3) goto LAB_0071726d;
      uVar18 = 0;
      uVar28 = 0;
      iVar25 = 0;
    }
    uVar18 = uVar18 | uVar28;
    if ((cVar21 == '\0') || (((SatInfo *)((long)&peVar19->ss + 0xc))->valid != true)) {
      uVar17 = 0;
      uVar28 = 0;
      iVar10 = 0;
    }
    else {
      iVar10 = *(int32_t *)((long)&peVar19->ss + 0x10);
      iVar11 = iVar10 + *(int32_t *)((long)&peVar14->ss + 0x14);
      iVar15 = *(int32_t *)((long)&peVar19->ss + 0x14);
      if (iVar11 < iVar15) {
        iVar11 = iVar15;
      }
      uVar28 = (ulong)(*(int32_t *)((long)&peVar14->ss + 0x10) + iVar10 + 1) << 0x20;
      iVar10 = 0;
      if (0 < iVar11) {
        iVar10 = iVar11;
      }
      iVar10 = iVar10 + 1;
      uVar17 = 1;
    }
    uVar17 = uVar17 | uVar28;
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar18;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)(uVar18 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)(uVar18 >> 0x20);
    (__return_storage_ptr__->sat).exec = iVar25;
    goto LAB_00717397;
  case OR_C:
    psVar9 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar14 = (psVar9->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    iVar10 = 0;
    if ((peVar14->ss).sat.valid == '\x01') {
      iVar11 = *(int32_t *)((long)&peVar14->ss + 8);
      uVar22 = *(int32_t *)((long)&peVar14->ss + 4) + 1;
      iVar15 = 0;
      if (0 < iVar11) {
        iVar15 = iVar11;
      }
      iVar15 = iVar15 + 1;
      uVar28 = 1;
    }
    else {
      uVar22 = 0;
      uVar28 = 0;
      iVar15 = 0;
    }
    if (((SatInfo *)((long)&peVar14->ss + 0xc))->valid == true) {
      peVar19 = psVar9[1].
                super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      if ((peVar19->ss).sat.valid == '\x01') {
        iVar10 = *(int32_t *)((long)&peVar14->ss + 0x14);
        iVar11 = 0;
        if (0 < iVar10) {
          iVar11 = iVar10;
        }
        iVar10 = *(int32_t *)((long)&peVar19->ss + 4);
        iVar24 = *(int32_t *)((long)&peVar19->ss + 8);
        uVar23 = *(int32_t *)((long)&peVar14->ss + 0x10) + iVar10 + 1;
        iVar10 = iVar11 + iVar10 + 1;
        if (iVar10 < iVar24) {
          iVar10 = iVar24;
        }
        uVar17 = 1;
      }
      else {
        uVar23 = 0;
        uVar17 = 0;
        iVar10 = 0;
      }
    }
    else {
      uVar23 = 0;
      uVar17 = 0;
    }
    uVar18 = uVar17;
    iVar11 = iVar10;
    uVar29 = uVar23;
    if ((uVar28 != 0) && (uVar18 = uVar28, iVar11 = iVar15, uVar29 = uVar22, uVar17 != 0)) {
      if ((int)uVar23 < (int)uVar22) {
        uVar23 = uVar22;
      }
      if (iVar10 < iVar15) {
        iVar10 = iVar15;
      }
      uVar18 = 1;
      iVar11 = iVar10;
      uVar29 = uVar23;
    }
    uVar18 = uVar18 | (ulong)uVar29 << 0x20;
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar18;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)(uVar18 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)(uVar18 >> 0x20);
    (__return_storage_ptr__->sat).exec = iVar11;
LAB_007171d9:
    (__return_storage_ptr__->dsat).valid = false;
    *(undefined3 *)&(__return_storage_ptr__->dsat).field_0x1 = 0;
    (__return_storage_ptr__->dsat).netdiff = 0;
    (__return_storage_ptr__->dsat).exec = 0;
    break;
  case OR_D:
    psVar9 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar14 = (psVar9->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    uVar26 = (ulong)(peVar14->ss).sat.valid;
    iVar10 = 0;
    if (uVar26 == 1) {
      iVar11 = *(int32_t *)((long)&peVar14->ss + 8);
      iVar15 = 1;
      if (1 < iVar11) {
        iVar15 = iVar11;
      }
      uVar17 = (ulong)(uint)*(int32_t *)((long)&peVar14->ss + 4) << 0x20;
    }
    else {
      iVar15 = 0;
      uVar17 = 0;
    }
    peVar19 = psVar9[1].
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    cVar21 = ((SatInfo *)((long)&peVar14->ss + 0xc))->valid;
    if (cVar21 == '\x01') {
      if ((peVar19->ss).sat.valid == '\x01') {
        iVar10 = *(int32_t *)((long)&peVar14->ss + 0x14);
        iVar11 = 0;
        if (0 < iVar10) {
          iVar11 = iVar10;
        }
        iVar24 = *(int32_t *)((long)&peVar19->ss + 4);
        iVar12 = *(int32_t *)((long)&peVar19->ss + 8);
        iVar10 = iVar11 + iVar24 + 1;
        if (iVar10 < iVar12) {
          iVar10 = iVar12;
        }
        uVar27 = (ulong)(*(int32_t *)((long)&peVar14->ss + 0x10) + iVar24 + 1) << 0x20;
        uVar18 = 1;
      }
      else {
        uVar27 = 0;
        uVar18 = 0;
        iVar10 = 0;
      }
    }
    else {
      uVar27 = 0;
      uVar18 = 0;
    }
    uVar28 = uVar17;
    if (uVar26 != 0) goto LAB_007172f2;
LAB_0071731a:
    iVar15 = iVar10;
    uVar20 = uVar27 >> 0x20;
    goto LAB_00717332;
  case OR_I:
    psVar9 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar14 = (psVar9->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar19 = psVar9[1].
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    SVar30 = miniscript::internal::operator|(&(peVar14->ss).sat,&(peVar19->ss).sat);
    uVar22 = 0;
    if (((undefined1  [12])SVar30 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
      uVar17 = 0;
      uVar28 = 0;
      uVar23 = 0;
    }
    else {
      uVar29 = SVar30.netdiff + 1;
      uVar23 = SVar30.exec;
      if (SVar30.exec <= (int)uVar29) {
        uVar23 = uVar29;
      }
      uVar17 = (ulong)uVar29 << 0x20;
      uVar28 = 1;
    }
    uVar17 = uVar17 | uVar28;
    SVar30 = miniscript::internal::operator|
                       ((SatInfo *)((long)&peVar14->ss + 0xc),(SatInfo *)((long)&peVar19->ss + 0xc))
    ;
    if (((undefined1  [12])SVar30 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
      uVar28 = 0;
      uVar18 = 0;
    }
    else {
      uVar29 = SVar30.netdiff + 1;
      uVar22 = SVar30.exec;
      if (SVar30.exec <= (int)uVar29) {
        uVar22 = uVar29;
      }
      uVar28 = (ulong)uVar29 << 0x20;
      uVar18 = 1;
    }
    uVar28 = uVar28 | uVar18;
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar17;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)(uVar17 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)(uVar17 >> 0x20);
    (__return_storage_ptr__->sat).exec = uVar23;
    (__return_storage_ptr__->dsat).valid = (bool)(char)uVar28;
    *(int3 *)&(__return_storage_ptr__->dsat).field_0x1 = (int3)(uVar28 >> 8);
    (__return_storage_ptr__->dsat).netdiff = (int)(uVar28 >> 0x20);
    (__return_storage_ptr__->dsat).exec = uVar22;
    break;
  case ANDOR:
    psVar9 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar14 = (psVar9->
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    iVar10 = 0;
    if (((peVar14->ss).sat.valid == '\x01') &&
       (peVar19 = psVar9[1].
                  super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr, (peVar19->ss).sat.valid == '\x01')) {
      iVar15 = *(int32_t *)((long)&peVar14->ss + 8);
      iVar11 = 0;
      if (0 < iVar15) {
        iVar11 = iVar15;
      }
      iVar24 = *(int32_t *)((long)&peVar19->ss + 4);
      iVar12 = *(int32_t *)((long)&peVar19->ss + 8);
      iVar15 = iVar24 + iVar11 + 1;
      if (iVar15 < iVar12) {
        iVar15 = iVar12;
      }
      uVar17 = (ulong)(*(int32_t *)((long)&peVar14->ss + 4) + iVar24 + 1) << 0x20;
      uVar28 = 1;
    }
    else {
      uVar17 = 0;
      uVar28 = 0;
      iVar15 = 0;
    }
    peVar19 = psVar9[2].
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    cVar21 = ((SatInfo *)((long)&peVar14->ss + 0xc))->valid;
    if (cVar21 == '\x01') {
      if ((peVar19->ss).sat.valid == '\x01') {
        iVar10 = *(int32_t *)((long)&peVar14->ss + 0x14);
        iVar11 = 0;
        if (0 < iVar10) {
          iVar11 = iVar10;
        }
        iVar24 = *(int32_t *)((long)&peVar19->ss + 4);
        iVar12 = *(int32_t *)((long)&peVar19->ss + 8);
        iVar10 = iVar11 + iVar24 + 1;
        if (iVar10 < iVar12) {
          iVar10 = iVar12;
        }
        uVar27 = (ulong)(*(int32_t *)((long)&peVar14->ss + 0x10) + iVar24 + 1) << 0x20;
        uVar18 = 1;
      }
      else {
        uVar27 = 0;
        uVar18 = 0;
        iVar10 = 0;
      }
    }
    else {
      uVar27 = 0;
      uVar18 = 0;
    }
    uVar26 = uVar17;
    if (uVar28 == 0) goto LAB_0071731a;
LAB_007172f2:
    uVar20 = uVar17 >> 0x20;
    if (uVar18 == 0) {
      uVar18 = uVar28 | uVar26;
    }
    else {
      uVar20 = uVar27 >> 0x20;
      uVar22 = (uint)(uVar17 >> 0x20);
      if ((int)(uVar27 >> 0x20) < (int)uVar22) {
        uVar20 = (ulong)uVar22;
      }
      if (iVar10 < iVar15) {
        iVar10 = iVar15;
      }
      uVar18 = 1;
      iVar15 = iVar10;
    }
LAB_00717332:
    uVar28 = uVar18 & 0xff | uVar20 << 0x20;
    if ((cVar21 == '\0') || (((SatInfo *)((long)&peVar19->ss + 0xc))->valid != true)) {
      uVar17 = 0;
      uVar18 = 0;
      iVar10 = 0;
    }
    else {
      iVar10 = *(int32_t *)((long)&peVar14->ss + 0x14);
      iVar11 = 0;
      if (0 < iVar10) {
        iVar11 = iVar10;
      }
      iVar24 = *(int32_t *)((long)&peVar19->ss + 0x10);
      iVar12 = *(int32_t *)((long)&peVar19->ss + 0x14);
      iVar10 = iVar11 + iVar24 + 1;
      if (iVar10 < iVar12) {
        iVar10 = iVar12;
      }
      uVar17 = (ulong)(*(int32_t *)((long)&peVar14->ss + 0x10) + iVar24 + 1) << 0x20;
      uVar18 = 1;
    }
    uVar17 = uVar17 | uVar18;
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar28;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)(uVar28 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)(uVar28 >> 0x20);
    (__return_storage_ptr__->sat).exec = iVar15;
LAB_00717397:
    (__return_storage_ptr__->dsat).valid = (bool)(char)uVar17;
    *(int3 *)&(__return_storage_ptr__->dsat).field_0x1 = (int3)(uVar17 >> 8);
    (__return_storage_ptr__->dsat).netdiff = (int)(uVar17 >> 0x20);
    (__return_storage_ptr__->dsat).exec = iVar10;
    break;
  case THRESH:
    local_78.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
    local_78.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)local_78.
                          super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
    local_58.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (SatInfo *)0x0;
    local_58.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (SatInfo *)0x0;
    std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
    reserve(&local_58,1);
    if (local_58.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
      _M_realloc_insert<miniscript::internal::SatInfo>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(SatInfo *)&local_78);
    }
    else {
      (local_58.
       super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish)->exec =
           (int32_t)local_78.
                    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       local_58.
       super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish =
           local_78.
           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_58.
      super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    psVar9 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->subs).
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar9) {
      uVar28 = 0;
      do {
        uVar22 = (uint)(uVar28 != 0);
        if (((local_58.
              super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
              ._M_impl.super__Vector_impl_data._M_start)->valid == true) &&
           (peVar14 = psVar9[uVar28].
                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr, (peVar14->ss).dsat.valid == true)) {
          iVar10 = (peVar14->ss).dsat.netdiff;
          iVar11 = iVar10 + (local_58.
                             super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start)->exec;
          iVar15 = (peVar14->ss).dsat.exec;
          if (iVar11 < iVar15) {
            iVar11 = iVar15;
          }
          local_88.exec = iVar11 + uVar22;
          if ((int)(iVar11 + uVar22) < (int)uVar22) {
            local_88.exec = uVar22;
          }
          local_88._0_8_ =
               (ulong)((local_58.
                        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start)->netdiff + iVar10 + uVar22) <<
               0x20;
          uVar17 = 1;
        }
        else {
          local_88._0_8_ = 0;
          uVar17 = 0;
          local_88.exec = 0;
        }
        local_88._0_8_ = local_88._0_8_ | uVar17;
        local_78.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = (SatInfo *)0x0;
        local_78.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (SatInfo *)0x0;
        std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
        reserve(&local_78,1);
        if (local_78.
            super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_78.
            super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
          ::_M_realloc_insert<miniscript::internal::SatInfo>
                    (&local_78,
                     (iterator)
                     local_78.
                     super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_88);
        }
        else {
          (local_78.
           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->exec = local_88.exec;
          (local_78.
           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->valid = local_88.valid;
          *(undefined3 *)
           &(local_78.
             super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish)->field_0x1 = local_88._1_3_;
          (local_78.
           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->netdiff = local_88.netdiff;
          local_78.
          super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_78.
               super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        lVar13 = (long)local_58.
                       super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_58.
                       super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if (1 < (ulong)((lVar13 >> 2) * -0x5555555555555555)) {
          uVar17 = 1;
          lVar16 = 0x14;
          do {
            peVar14 = (this->subs).
                      super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar28].
                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            iVar10 = 0;
            if ((*(char *)((long)local_58.
                                 super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar16 + -8) == '\x01')
               && (((SatInfo *)((long)&peVar14->ss + 0xc))->valid == true)) {
              iVar15 = *(int32_t *)((long)&peVar14->ss + 0x10);
              iVar24 = *(int32_t *)((long)&peVar14->ss + 0x14);
              iVar11 = *(int *)((long)local_58.
                                      super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar16 + -4) +
                       iVar15;
              iVar15 = iVar15 + *(int *)(&(local_58.
                                           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->valid +
                                        lVar16);
              if (iVar15 < iVar24) {
                iVar15 = iVar24;
              }
              bVar5 = true;
            }
            else {
              iVar11 = 0;
              bVar5 = false;
              iVar15 = 0;
            }
            if (*(char *)((long)local_58.
                                super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x14) ==
                '\x01') {
              if ((peVar14->ss).sat.valid == '\x01') {
                iVar10 = *(int32_t *)((long)&peVar14->ss + 4);
                iVar12 = *(int32_t *)((long)&peVar14->ss + 8);
                iVar24 = *(int *)((long)local_58.
                                        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x10)
                         + iVar10;
                iVar10 = iVar10 + *(int *)(&local_58.
                                            super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                            ._M_impl.super__Vector_impl_data._M_start[-1].valid +
                                          lVar16);
                if (iVar10 < iVar12) {
                  iVar10 = iVar12;
                }
                bVar4 = true;
              }
              else {
                iVar24 = 0;
                bVar4 = false;
                iVar10 = 0;
              }
            }
            else {
              iVar24 = 0;
              bVar4 = false;
            }
            iVar12 = iVar24;
            iVar8 = iVar10;
            bVar3 = bVar4;
            if ((bVar5) && (iVar12 = iVar11, iVar8 = iVar15, bVar3 = bVar5, bVar4)) {
              iVar12 = iVar24;
              if (iVar24 < iVar11) {
                iVar12 = iVar11;
              }
              iVar8 = iVar10;
              if (iVar10 < iVar15) {
                iVar8 = iVar15;
              }
LAB_00716f5a:
              local_88.exec = iVar8 + uVar22;
              if ((int)(iVar8 + uVar22) < (int)uVar22) {
                local_88.exec = uVar22;
              }
              local_88._0_8_ = (ulong)(iVar12 + uVar22) << 0x20;
              uVar18 = 1;
            }
            else {
              if (bVar3) goto LAB_00716f5a;
              local_88._0_8_ = 0;
              uVar18 = 0;
              local_88.exec = 0;
            }
            local_88._0_8_ = local_88._0_8_ | uVar18;
            if (local_78.
                super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_78.
                super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
              ::_M_realloc_insert<miniscript::internal::SatInfo>
                        (&local_78,
                         (iterator)
                         local_78.
                         super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_88);
            }
            else {
              (local_78.
               super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish)->exec = local_88.exec;
              (local_78.
               super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish)->valid = (bool)(char)local_88._0_8_;
              *(int3 *)&(local_78.
                         super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->field_0x1 =
                   (int3)((ulong)local_88._0_8_ >> 8);
              (local_78.
               super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish)->netdiff =
                   (int)((ulong)local_88._0_8_ >> 0x20);
              local_78.
              super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_78.
                   super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar17 = uVar17 + 1;
            lVar13 = (long)local_58.
                           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_58.
                           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            lVar16 = lVar16 + 0xc;
          } while (uVar17 < (ulong)((lVar13 >> 2) * -0x5555555555555555));
        }
        if (((&local_58.
               super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
               ._M_impl.super__Vector_impl_data._M_start[-1].valid)[lVar13] == true) &&
           (peVar14 = (this->subs).
                      super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar28].
                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr, (peVar14->ss).sat.valid == '\x01')) {
          iVar10 = *(int32_t *)((long)&peVar14->ss + 4);
          iVar11 = iVar10 + *(int *)((long)local_58.
                                           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar13 + -4);
          iVar15 = *(int32_t *)((long)&peVar14->ss + 8);
          if (iVar11 < iVar15) {
            iVar11 = iVar15;
          }
          local_88.exec = iVar11 + uVar22;
          if ((int)(iVar11 + uVar22) < (int)uVar22) {
            local_88.exec = uVar22;
          }
          local_88._0_8_ =
               (ulong)(*(int *)((long)local_58.
                                      super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar13 + -8) +
                       iVar10 + uVar22) << 0x20;
          uVar17 = 1;
        }
        else {
          local_88._0_8_ = 0;
          uVar17 = 0;
          local_88.exec = 0;
        }
        local_88._0_8_ = local_88._0_8_ | uVar17;
        if (local_78.
            super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_78.
            super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
          ::_M_realloc_insert<miniscript::internal::SatInfo>
                    (&local_78,
                     (iterator)
                     local_78.
                     super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_88);
          local_58.
          super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_78.
               super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (local_78.
           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->exec = local_88.exec;
          (local_78.
           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->valid = (bool)(char)local_88._0_8_;
          *(int3 *)&(local_78.
                     super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->field_0x1 =
               (int3)((ulong)local_88._0_8_ >> 8);
          (local_78.
           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->netdiff =
               (int)((ulong)local_88._0_8_ >> 0x20);
          local_58.
          super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_78.
               super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pSVar7 = local_58.
                 super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pSVar6 = local_58.
                 super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_58.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_78.
             super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_58.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_78.
             super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_78.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if ((pSVar6 != (pointer)0x0) &&
           (operator_delete(pSVar6,(long)pSVar7 - (long)pSVar6),
           local_78.
           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
           ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
          operator_delete(local_78.
                          super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        uVar28 = uVar28 + 1;
        psVar9 = (this->subs).
                 super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar28 < (ulong)((long)(this->subs).
                                      super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9 >> 4
                               ));
    }
    uVar22 = this->k;
    iVar10 = 0;
    if ((ulong)local_58.
               super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar22].valid == 1) {
      iVar15 = 1;
      if (1 < local_58.
              super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar22].exec) {
        iVar15 = local_58.
                 super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar22].exec;
      }
      uVar28 = (ulong)(uint)local_58.
                            super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar22].netdiff << 0x20;
    }
    else {
      iVar15 = 0;
      uVar28 = 0;
    }
    uVar28 = uVar28 | local_58.
                      super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar22].valid;
    if ((ulong)(local_58.
                super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                ._M_impl.super__Vector_impl_data._M_start)->valid == 1) {
      iVar10 = 1;
      if (1 < (local_58.
               super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
               ._M_impl.super__Vector_impl_data._M_start)->exec) {
        iVar10 = (local_58.
                  super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start)->exec;
      }
      uVar17 = (ulong)(uint)(local_58.
                             super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start)->netdiff << 0x20;
    }
    else {
      uVar17 = 0;
    }
    uVar17 = uVar17 | (local_58.
                       super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start)->valid;
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar28;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)(uVar28 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)(uVar28 >> 0x20);
    (__return_storage_ptr__->sat).exec = iVar15;
    (__return_storage_ptr__->dsat).valid = (bool)(char)uVar17;
    *(int3 *)&(__return_storage_ptr__->dsat).field_0x1 = (int3)(uVar17 >> 8);
    (__return_storage_ptr__->dsat).netdiff = (int)(uVar17 >> 0x20);
    (__return_storage_ptr__->dsat).exec = iVar10;
    operator_delete(local_58.
                    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    break;
  case MULTI:
    iVar10 = (*(int *)&(this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                       super__Vector_impl_data._M_finish -
             *(int *)&(this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                      super__Vector_impl_data._M_start) * -0x3f03f03f + this->k + 2;
    lVar13 = ((ulong)this->k << 0x20) + 1;
    *(long *)&__return_storage_ptr__->sat = lVar13;
LAB_00716969:
    (__return_storage_ptr__->sat).exec = iVar10;
    (__return_storage_ptr__->dsat).valid = (bool)(char)lVar13;
    *(int3 *)&(__return_storage_ptr__->dsat).field_0x1 = (int3)((ulong)lVar13 >> 8);
    (__return_storage_ptr__->dsat).netdiff = (int)((ulong)lVar13 >> 0x20);
    (__return_storage_ptr__->dsat).exec = iVar10;
    break;
  case MULTI_A:
    lVar13 = ((long)(this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                   super__Vector_impl_data._M_start) * 0xfc0fc0fc0fc0fc1;
    lVar16 = (lVar13 << 0x20) + -0xffffffff;
    *(long *)&__return_storage_ptr__->sat = lVar16;
    iVar25 = (int32_t)lVar13;
    (__return_storage_ptr__->sat).exec = iVar25;
    *(long *)&__return_storage_ptr__->dsat = lVar16;
    (__return_storage_ptr__->dsat).exec = iVar25;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                  ,0x452,
                  "internal::StackSize miniscript::Node<CPubKey>::CalcStackSize() const [Key = CPubKey]"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00717452:
  __stack_chk_fail();
}

Assistant:

internal::StackSize CalcStackSize() const {
        using namespace internal;
        switch (fragment) {
            case Fragment::JUST_0: return {{}, SatInfo::Push()};
            case Fragment::JUST_1: return {SatInfo::Push(), {}};
            case Fragment::OLDER:
            case Fragment::AFTER: return {SatInfo::Push() + SatInfo::Nop(), {}};
            case Fragment::PK_K: return {SatInfo::Push()};
            case Fragment::PK_H: return {SatInfo::OP_DUP() + SatInfo::Hash() + SatInfo::Push() + SatInfo::OP_EQUALVERIFY()};
            case Fragment::SHA256:
            case Fragment::RIPEMD160:
            case Fragment::HASH256:
            case Fragment::HASH160: return {
                SatInfo::OP_SIZE() + SatInfo::Push() + SatInfo::OP_EQUALVERIFY() + SatInfo::Hash() + SatInfo::Push() + SatInfo::OP_EQUAL(),
                {}
            };
            case Fragment::ANDOR: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                const auto& z{subs[2]->ss};
                return {
                    (x.sat + SatInfo::If() + y.sat) | (x.dsat + SatInfo::If() + z.sat),
                    x.dsat + SatInfo::If() + z.dsat
                };
            }
            case Fragment::AND_V: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {x.sat + y.sat, {}};
            }
            case Fragment::AND_B: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {x.sat + y.sat + SatInfo::BinaryOp(), x.dsat + y.dsat + SatInfo::BinaryOp()};
            }
            case Fragment::OR_B: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {
                    ((x.sat + y.dsat) | (x.dsat + y.sat)) + SatInfo::BinaryOp(),
                    x.dsat + y.dsat + SatInfo::BinaryOp()
                };
            }
            case Fragment::OR_C: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {(x.sat + SatInfo::If()) | (x.dsat + SatInfo::If() + y.sat), {}};
            }
            case Fragment::OR_D: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {
                    (x.sat + SatInfo::OP_IFDUP(true) + SatInfo::If()) | (x.dsat + SatInfo::OP_IFDUP(false) + SatInfo::If() + y.sat),
                    x.dsat + SatInfo::OP_IFDUP(false) + SatInfo::If() + y.dsat
                };
            }
            case Fragment::OR_I: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {SatInfo::If() + (x.sat | y.sat), SatInfo::If() + (x.dsat | y.dsat)};
            }
            // multi(k, key1, key2, ..., key_n) starts off with k+1 stack elements (a 0, plus k
            // signatures), then reaches n+k+3 stack elements after pushing the n keys, plus k and
            // n itself, and ends with 1 stack element (success or failure). Thus, it net removes
            // k elements (from k+1 to 1), while reaching k+n+2 more than it ends with.
            case Fragment::MULTI: return {SatInfo(k, k + keys.size() + 2)};
            // multi_a(k, key1, key2, ..., key_n) starts off with n stack elements (the
            // signatures), reaches 1 more (after the first key push), and ends with 1. Thus it net
            // removes n-1 elements (from n to 1) while reaching n more than it ends with.
            case Fragment::MULTI_A: return {SatInfo(keys.size() - 1, keys.size())};
            case Fragment::WRAP_A:
            case Fragment::WRAP_N:
            case Fragment::WRAP_S: return subs[0]->ss;
            case Fragment::WRAP_C: return {
                subs[0]->ss.sat + SatInfo::OP_CHECKSIG(),
                subs[0]->ss.dsat + SatInfo::OP_CHECKSIG()
            };
            case Fragment::WRAP_D: return {
                SatInfo::OP_DUP() + SatInfo::If() + subs[0]->ss.sat,
                SatInfo::OP_DUP() + SatInfo::If()
            };
            case Fragment::WRAP_V: return {subs[0]->ss.sat + SatInfo::OP_VERIFY(), {}};
            case Fragment::WRAP_J: return {
                SatInfo::OP_SIZE() + SatInfo::OP_0NOTEQUAL() + SatInfo::If() + subs[0]->ss.sat,
                SatInfo::OP_SIZE() + SatInfo::OP_0NOTEQUAL() + SatInfo::If()
            };
            case Fragment::THRESH: {
                // sats[j] is the SatInfo corresponding to all traces reaching j satisfactions.
                auto sats = Vector(SatInfo::Empty());
                for (size_t i = 0; i < subs.size(); ++i) {
                    // Loop over the subexpressions, processing them one by one. After adding
                    // element i we need to add OP_ADD (if i>0).
                    auto add = i ? SatInfo::BinaryOp() : SatInfo::Empty();
                    // Construct a variable that will become the next sats, starting with index 0.
                    auto next_sats = Vector(sats[0] + subs[i]->ss.dsat + add);
                    // Then loop to construct next_sats[1..i].
                    for (size_t j = 1; j < sats.size(); ++j) {
                        next_sats.push_back(((sats[j] + subs[i]->ss.dsat) | (sats[j - 1] + subs[i]->ss.sat)) + add);
                    }
                    // Finally construct next_sats[i+1].
                    next_sats.push_back(sats[sats.size() - 1] + subs[i]->ss.sat + add);
                    // Switch over.
                    sats = std::move(next_sats);
                }
                // To satisfy thresh we need k satisfactions; to dissatisfy we need 0. In both
                // cases a push of k and an OP_EQUAL follow.
                return {
                    sats[k] + SatInfo::Push() + SatInfo::OP_EQUAL(),
                    sats[0] + SatInfo::Push() + SatInfo::OP_EQUAL()
                };
            }
        }
        assert(false);
    }